

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

xmlSchemaFacetPtr xmlSchemaNewFacet(void)

{
  xmlSchemaFacetPtr pxVar1;
  
  pxVar1 = (xmlSchemaFacetPtr)(*xmlMalloc)(0x48);
  if (pxVar1 != (xmlSchemaFacetPtr)0x0) {
    pxVar1->fixed = 0;
    pxVar1->whitespace = 0;
    pxVar1->val = (xmlSchemaValPtr)0x0;
    pxVar1->annot = (xmlSchemaAnnotPtr)0x0;
    pxVar1->node = (xmlNodePtr)0x0;
    pxVar1->value = (xmlChar *)0x0;
    pxVar1->id = (xmlChar *)0x0;
    *(undefined8 *)pxVar1 = 0;
    pxVar1->next = (_xmlSchemaFacet *)0x0;
    pxVar1->regexp = (xmlRegexpPtr)0x0;
  }
  return pxVar1;
}

Assistant:

xmlSchemaFacetPtr
xmlSchemaNewFacet(void)
{
    xmlSchemaFacetPtr ret;

    ret = (xmlSchemaFacetPtr) xmlMalloc(sizeof(xmlSchemaFacet));
    if (ret == NULL) {
        return (NULL);
    }
    memset(ret, 0, sizeof(xmlSchemaFacet));

    return (ret);
}